

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O1

array<int,_6UL> * __thiscall
MeteomaticsApiClient::addDayToToday
          (array<int,_6UL> *__return_storage_ptr__,MeteomaticsApiClient *this,int days)

{
  tm *ptVar1;
  time_t later_time;
  time_t ltime;
  time_t local_20;
  long local_18;
  
  local_18 = std::chrono::_V2::system_clock::now();
  local_18 = local_18 / 1000000000;
  ptVar1 = gmtime(&local_18);
  ptVar1->tm_mday = ptVar1->tm_mday + days;
  local_20 = mktime(ptVar1);
  ptVar1 = gmtime(&local_20);
  __return_storage_ptr__->_M_elems[0] = ptVar1->tm_year + 0x76c;
  __return_storage_ptr__->_M_elems[1] = ptVar1->tm_mon + 1;
  __return_storage_ptr__->_M_elems[2] = ptVar1->tm_mday;
  __return_storage_ptr__->_M_elems[3] = ptVar1->tm_hour;
  __return_storage_ptr__->_M_elems[4] = ptVar1->tm_min;
  __return_storage_ptr__->_M_elems[5] = ptVar1->tm_sec;
  return __return_storage_ptr__;
}

Assistant:

const std::array<int,6> MeteomaticsApiClient::addDayToToday(const int days) const
{
    std::time_t ltime = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
    struct tm *Tm;
    
    Tm=std::gmtime(&ltime);
    
    Tm->tm_mday += days;
    std::time_t later_time = mktime(Tm);
    Tm=std::gmtime(&later_time);
    
    std::array<int,6> tomorrows_time;
    tomorrows_time[0] = Tm->tm_year+1900;
    tomorrows_time[1] = Tm->tm_mon+1;
    tomorrows_time[2] = Tm->tm_mday;
    tomorrows_time[3] = Tm->tm_hour;
    tomorrows_time[4] = Tm->tm_min;
    tomorrows_time[5] = Tm->tm_sec;
    
    return tomorrows_time;
}